

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoInput.cpp
# Opt level: O3

void __thiscall PianoInput::mapBindings(PianoInput *this)

{
  QHash<int,_int> *this_00;
  long lVar1;
  int iVar2;
  long lVar3;
  int i;
  int iVar4;
  int local_48;
  int local_44 [3];
  long local_38;
  
  this_00 = &this->mBindingLookup;
  QHash<int,_int>::clear(this_00);
  local_44[0] = 0;
  local_44[1] = 0xc;
  lVar3 = 8;
  lVar1 = 0;
  do {
    local_38 = lVar1;
    iVar2 = *(int *)((long)local_44 + lVar1);
    iVar4 = 0;
    do {
      local_48 = *(int *)((long)(this->mBindings)._M_elems + lVar3 + -8);
      local_44[2] = iVar4 + iVar2;
      if (local_48 != 0) {
        QHash<int,int>::emplace<int_const&>((QHash<int,int> *)this_00,&local_48,local_44 + 2);
      }
      iVar4 = iVar4 + 1;
      lVar3 = lVar3 + 4;
    } while (iVar4 != 0x18);
    lVar1 = local_38 + 4;
  } while (lVar1 != 8);
  if (lVar3 != 0xcc) {
    iVar2 = 0x24;
    do {
      iVar4 = *(int *)((long)(this->mBindings)._M_elems + lVar3 + -8);
      if (iVar4 != 0) {
        local_44[0] = iVar4;
        local_48 = iVar2;
        QHash<int,int>::emplace<int_const&>((QHash<int,int> *)this_00,local_44,&local_48);
      }
      lVar3 = lVar3 + 4;
      iVar2 = iVar2 + 1;
    } while (lVar3 != 0xcc);
  }
  return;
}

Assistant:

void PianoInput::mapBindings() {
    mBindingLookup.clear();

    auto mapKey = [this](Qt::Key key, int semitone) {
        if (key != NoKey) {
            mBindingLookup.insert(key, semitone);
        }
    };

    auto iter = mBindings.begin();
    // lower and upper rows (lower octave starts at 0, upper at 1)
    for (auto semitone : {0, 12}) {
        for (int i = 0; i < BindsPerRow; ++i) {
            mapKey(*iter++, semitone++);
        }
    }
    // specials
    int special = SPECIAL_START;
    while (iter != mBindings.end()) {
        mapKey(*iter++, special++);
    }

}